

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageIOTests.cpp
# Opt level: O2

void __thiscall dit::ImageReadCase::~ImageReadCase(ImageReadCase *this)

{
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__ImageReadCase_0027efa0;
  std::__cxx11::string::~string((string *)&this->m_filename);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ImageReadCase (tcu::TestContext& testCtx, const char* name, const char* filename, deUint32 expectedHash)
		: TestCase			(testCtx, name, filename)
		, m_filename		(filename)
		, m_expectedHash	(expectedHash)
	{
	}